

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O3

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitArrayGet(InternalAnalyzer *this,ArrayGet *curr)

{
  EffectAnalyzer *pEVar1;
  bool bVar2;
  Type *this_00;
  HeapType local_20;
  
  this_00 = &curr->ref->type;
  bVar2 = wasm::Type::isRef(this_00);
  if (bVar2) {
    local_20 = wasm::Type::getHeapType(this_00);
    bVar2 = HeapType::isBottom(&local_20);
    if (bVar2) {
      this->parent->trap = true;
      return;
    }
  }
  pEVar1 = this->parent;
  pEVar1->readsArray = true;
  pEVar1->implicitTrap = true;
  return;
}

Assistant:

void visitArrayGet(ArrayGet* curr) {
      if (curr->ref->type.isNull()) {
        parent.trap = true;
        return;
      }
      parent.readsArray = true;
      // traps when the arg is null or the index out of bounds
      parent.implicitTrap = true;
    }